

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O3

int16_t __thiscall BoxNesting::KuhnAlgorithm::runAlgorithm(KuhnAlgorithm *this)

{
  uint uVar1;
  ulong *puVar2;
  bool bVar3;
  short sVar4;
  long lVar5;
  ulong *__s;
  ulong uVar6;
  byte bVar7;
  
  do {
    __s = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p;
    puVar2 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar1 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_finish.super__Bit_iterator_base._M_offset;
    if (__s != puVar2) {
      memset(__s,0,(long)puVar2 - (long)__s);
      __s = puVar2;
    }
    if (uVar1 != 0) {
      *__s = *__s & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
    }
    sVar4 = this->leftVerticesCount;
    if (sVar4 < 1) break;
    uVar6 = 0;
    bVar7 = 0;
    do {
      if (((this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6] == -1) &&
         ((*(ulong *)((long)(this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     (ulong)((uint)(uVar6 >> 3) & 0x1ff8)) >> (uVar6 & 0x3f) & 1) == 0)) {
        bVar3 = kuhn(this,(int16_t)uVar6);
        bVar7 = bVar7 | bVar3;
        sVar4 = this->leftVerticesCount;
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)sVar4);
  } while (bVar7 != 0);
  if (0 < (long)this->rightVerticesCount) {
    lVar5 = 0;
    do {
      sVar4 = sVar4 - (ushort)((this->pairsRight).super__Vector_base<short,_std::allocator<short>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar5] != -1);
      lVar5 = lVar5 + 1;
    } while (this->rightVerticesCount != lVar5);
  }
  return sVar4;
}

Assistant:

int16_t KuhnAlgorithm::runAlgorithm() const
{
	bool pathFound;
	do {
		fill(this->used.begin(), this->used.end(), false);
		pathFound = false;
		// remember to start only from free vertices which are not visited yet
		for (int16_t i = 0; i < this->leftVerticesCount; ++i) {
			if (this->pairsLeft[i] == -1 && !this->used[i]) {
				pathFound |= kuhn(i);
			}
		}
	} while (pathFound);

	// We have the same amount of visible boxes as there
	// are vertices in the left part of the bipartite graph
	// for each valid match (i.e. a box can nest inside another box)
	// we remove a visible box
	int16_t visibleBoxes = this->leftVerticesCount;
	for (int16_t i = 0; i < this->rightVerticesCount; ++i) {
		if (this->pairsRight[i] != -1) {
			--visibleBoxes;
		}
	}

	return visibleBoxes;
}